

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

void setupBiomeFilter(BiomeFilter *bf,int mc,uint32_t flags,int *required,int requiredLen,
                     int *excluded,int excludedLen,int *matchany,int matchanyLen)

{
  int iVar1;
  byte bVar2;
  long in_RCX;
  uint in_EDX;
  int in_ESI;
  ulong *in_RDI;
  int in_R8D;
  long in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  int temp;
  int j;
  uint64_t m;
  uint64_t b;
  BiomeFilter ibf;
  int id;
  int i;
  int in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  uint in_stack_fffffffffffffee0;
  uint uVar3;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  
  memset(in_RDI,0,0xd8);
  *(uint *)((long)in_RDI + 0x5c) = in_EDX;
  for (iVar4 = 0; iVar4 < in_stack_00000018; iVar4 = iVar4 + 1) {
    iVar1 = *(int *)(CONCAT44(in_stack_00000014,in_stack_00000010) + (long)iVar4 * 4);
    if (iVar1 < 0x80) {
      in_RDI[0x19] = 1L << ((byte)iVar1 & 0x3f) | in_RDI[0x19];
    }
    else {
      in_RDI[0x1a] = 1L << ((byte)iVar1 + 0x80 & 0x3f) | in_RDI[0x1a];
    }
    in_stack_fffffffffffffec0 = 0;
    in_stack_fffffffffffffec8 = 0;
    setupBiomeFilter((BiomeFilter *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                     (uint32_t)in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_R9 >> 0x20),(int *)CONCAT44(iVar4,iVar1),unaff_retaddr,
                     (int *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010);
    if (iVar4 == 0) {
      *in_RDI = local_108;
      in_RDI[1] = local_100;
      in_RDI[2] = local_f8;
      in_RDI[3] = local_f0;
      in_RDI[4] = local_e8;
      in_RDI[5] = local_e0;
      in_RDI[6] = local_d8;
      in_RDI[7] = local_d0;
      in_RDI[8] = local_c8;
      in_RDI[9] = local_c0;
      in_RDI[10] = local_b8;
    }
    else {
      *in_RDI = local_108 & *in_RDI;
      in_RDI[1] = local_100 & in_RDI[1];
      in_RDI[2] = local_f8 & in_RDI[2];
      in_RDI[3] = local_f0 & in_RDI[3];
      in_RDI[4] = local_e8 & in_RDI[4];
      in_RDI[5] = local_e0 & in_RDI[5];
      in_RDI[6] = local_d8 & in_RDI[6];
      in_RDI[7] = local_d0 & in_RDI[7];
      in_RDI[8] = local_c8 & in_RDI[8];
      in_RDI[9] = local_c0 & in_RDI[9];
      in_RDI[10] = local_b8 & in_RDI[10];
    }
  }
  for (iVar4 = 0; iVar4 < in_stack_00000008; iVar4 = iVar4 + 1) {
    uVar3 = *(uint *)(in_R9 + (long)iVar4 * 4);
    if ((uVar3 & 0xffffff40) != 0) {
      fprintf(_stderr,"setupBiomeFilter: biomeID=%d not supported.\n",(ulong)uVar3);
      exit(-1);
    }
    if ((int)uVar3 < 0x80) {
      in_RDI[0x15] = 1L << ((byte)uVar3 & 0x3f) | in_RDI[0x15];
    }
    else {
      in_RDI[0x16] = 1L << ((byte)uVar3 + 0x80 & 0x3f) | in_RDI[0x16];
    }
  }
  if ((in_stack_00000008 != 0) && (9 < in_ESI)) {
    for (uVar3 = 0; (int)uVar3 < 10; uVar3 = uVar3 + 1) {
      in_stack_fffffffffffffedc = uVar3;
      if (4 < (int)uVar3) {
        in_stack_fffffffffffffedc = uVar3 - 5 | 0xf00;
      }
      in_stack_fffffffffffffee0 = in_stack_fffffffffffffedc;
      genPotential((uint64_t *)CONCAT44(uVar3,in_stack_fffffffffffffedc),
                   (uint64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    }
    for (iVar4 = 0; iVar4 < 0x100; iVar4 = iVar4 + 1) {
      iVar1 = isOverworld((int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      if (iVar1 != 0) {
        if (iVar4 < 0x80) {
          genPotential((uint64_t *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                       (uint64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                       (int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                       in_stack_fffffffffffffec8);
        }
        genPotential((uint64_t *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
        genPotential((uint64_t *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
        genPotential((uint64_t *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
        genPotential((uint64_t *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                     (uint64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      }
    }
  }
  iVar4 = 0;
  while( true ) {
    if (in_R8D <= iVar4) {
      in_RDI[0x17] = in_RDI[8];
      in_RDI[0x17] = in_RDI[0x17] & 0xfffffffffefffffe;
      in_RDI[0x17] = in_RDI[10] | in_RDI[0x17];
      in_RDI[0x18] = in_RDI[9];
      in_RDI[6] = in_RDI[8];
      in_RDI[6] = in_RDI[6] & 0xfffffffffffff77f;
      in_RDI[7] = in_RDI[9];
      *(undefined4 *)(in_RDI + 0xb) = 0;
      *(uint *)(in_RDI + 0xb) = (uint)((*in_RDI & 0x40) != 0) + (int)in_RDI[0xb];
      *(uint *)(in_RDI + 0xb) = (uint)((*in_RDI & 0x80) != 0) + (int)in_RDI[0xb];
      *(uint *)(in_RDI + 0xb) = (uint)((*in_RDI & 0x100) != 0) + (int)in_RDI[0xb];
      return;
    }
    uVar3 = *(uint *)(in_RCX + (long)iVar4 * 4);
    if ((uVar3 & 0xffffff40) != 0) break;
    bVar2 = (byte)uVar3;
    switch(uVar3) {
    case 1:
    case 4:
    case 0x12:
      in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
      in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      break;
    case 2:
      in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      break;
    case 3:
      in_RDI[2] = in_RDI[2] | 8;
    case 0x22:
      in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
      in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      break;
    case 5:
    case 0x13:
      in_RDI[3] = in_RDI[3] | 0x20;
      in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
      in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      break;
    case 6:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x86:
    case 0x9b:
    case 0x9c:
    case 0x9d:
      *in_RDI = *in_RDI | 4;
      if ((uVar3 == 0x1d) || (uVar3 == 0x9d)) {
        in_RDI[2] = in_RDI[2] | 0x20000000;
        in_RDI[3] = in_RDI[3] | 0x20000000;
      }
      else if ((((uVar3 == 0x1b) || (uVar3 == 0x1c)) || (uVar3 == 0x9b)) || (uVar3 == 0x9c)) {
        in_RDI[2] = in_RDI[2] | 0x8000000;
        in_RDI[3] = in_RDI[3] | 0x8000000;
      }
      else if ((uVar3 == 6) || (uVar3 == 0x86)) {
        in_RDI[2] = in_RDI[2] | 0x40;
        in_RDI[3] = in_RDI[3] | 0x40;
      }
      if ((int)uVar3 < 0x80) {
        in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
        in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      }
      else {
        in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
        in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      }
      break;
    default:
      iVar1 = isOceanic(uVar3);
      bVar2 = (byte)uVar3;
      if (iVar1 == 0) {
        if ((int)uVar3 < 0x40) {
          in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
        }
        else {
          in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
        }
      }
      else {
        *in_RDI = *in_RDI | 1;
        in_RDI[10] = 1L << (bVar2 & 0x3f) | in_RDI[10];
        iVar1 = isShallowOcean(uVar3);
        if (iVar1 == 0) {
          if (uVar3 == 0x2f) {
            in_RDI[1] = in_RDI[1] | 0x100000000000;
          }
          else if (uVar3 == 0x18) {
            in_RDI[1] = in_RDI[1] | 1;
          }
          else if (uVar3 == 0x32) {
            in_RDI[1] = in_RDI[1] | 0x400;
          }
          if ((in_EDX & 4) == 0) {
            in_RDI[4] = in_RDI[4] | 0x1000000;
            in_RDI[8] = in_RDI[8] | 0x1000000;
          }
        }
        else if ((uVar3 != 0x2d) && (uVar3 != 0x2e)) {
          in_RDI[1] = 1L << ((byte)uVar3 & 0x3f) | in_RDI[1];
        }
      }
      break;
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x1e:
    case 0x1f:
    case 0x8c:
    case 0x9e:
      *in_RDI = *in_RDI | 0x10;
      if (((uVar3 == 0x1e) || (uVar3 == 0x1f)) || (uVar3 == 0x9e)) {
        in_RDI[3] = in_RDI[3] | 0x40000000;
      }
      else {
        in_RDI[3] = in_RDI[3] | 0x1000;
      }
      if (uVar3 == 0xb) {
        in_RDI[4] = in_RDI[4] | 0x1000;
        in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      }
      else if ((int)uVar3 < 0x80) {
        in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
        in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      }
      else {
        in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
        in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      }
      break;
    case 0xe:
      in_RDI[4] = in_RDI[4] | 0x4000;
    case 0xf:
      *in_RDI = *in_RDI | 1;
      in_RDI[2] = in_RDI[2] | 0x4000;
      in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      break;
    case 0x11:
    case 0x23:
    case 0x24:
    case 0x82:
    case 0xa3:
    case 0xa4:
      *in_RDI = *in_RDI | 2;
      if ((uVar3 == 0x11) || (uVar3 == 0x82)) {
        in_RDI[2] = in_RDI[2] | 4;
        in_RDI[3] = in_RDI[3] | 4;
      }
      else {
        in_RDI[2] = in_RDI[2] | 0x800000000;
        in_RDI[3] = in_RDI[3] | 0x800000000;
      }
      if ((int)uVar3 < 0x80) {
        in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
        in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      }
      else {
        in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
        in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      }
      break;
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x95:
    case 0x97:
    case 0xa8:
    case 0xa9:
      *in_RDI = *in_RDI | 0x80;
      in_RDI[2] = in_RDI[2] | 0x200000;
      if ((uVar3 == 0xa8) || (uVar3 == 0xa9)) {
        in_RDI[3] = in_RDI[3] | 0x10000000000;
        in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
        in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      }
      else if (uVar3 == 0x17) {
        in_RDI[8] = in_RDI[8] | 0x800000;
      }
      else {
        if (uVar3 == 0x97) {
          in_RDI[3] = in_RDI[3] | 0x800000;
        }
        else {
          in_RDI[3] = in_RDI[3] | 0x200000;
        }
        if ((int)uVar3 < 0x80) {
          in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
          in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
        }
        else {
          in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
          in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
        }
      }
      break;
    case 0x1a:
      *in_RDI = *in_RDI | 0x10;
    case 0x10:
    case 0x19:
      in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      break;
    case 0x20:
    case 0x21:
    case 0xa0:
    case 0xa1:
      *in_RDI = *in_RDI | 0x100;
      in_RDI[2] = in_RDI[2] | 0x100000000;
      in_RDI[3] = in_RDI[3] | 0x100000000;
      if ((int)uVar3 < 0x80) {
        in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
        in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      }
      else {
        in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
        in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      }
      break;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0xa5:
    case 0xa6:
    case 0xa7:
      *in_RDI = *in_RDI | 0x40;
      if ((uVar3 == 0x27) || (uVar3 == 0xa7)) {
        in_RDI[2] = in_RDI[2] | 0x8000000000;
      }
      if ((uVar3 == 0x26) || (uVar3 == 0xa6)) {
        in_RDI[2] = in_RDI[2] | 0x4000000000;
      }
      if ((int)uVar3 < 0x80) {
        in_RDI[4] = 1L << (bVar2 & 0x3f) | in_RDI[4];
        in_RDI[8] = 1L << (bVar2 & 0x3f) | in_RDI[8];
      }
      else {
        in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
        in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      }
      break;
    case 0x81:
      in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
      in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      break;
    case 0x83:
      in_RDI[2] = in_RDI[2] | 8;
    case 0xa2:
      in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
      in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      break;
    case 0x84:
      in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
      in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
      break;
    case 0x85:
      in_RDI[3] = in_RDI[3] | 0x20;
      in_RDI[5] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[5];
      in_RDI[9] = 1L << (bVar2 + 0x80 & 0x3f) | in_RDI[9];
    }
    iVar4 = iVar4 + 1;
  }
  fprintf(_stderr,"setupBiomeFilter: biomeID=%d not supported.\n",(ulong)uVar3);
  exit(-1);
}

Assistant:

void setupBiomeFilter(
    BiomeFilter *bf,
    int mc, uint32_t flags,
    const int *required, int requiredLen,
    const int *excluded, int excludedLen,
    const int *matchany, int matchanyLen)
{
    int i, id;

    memset(bf, 0, sizeof(*bf));
    bf->flags = flags;

    // The matchany set is built from the intersection of each member,
    // individually treated as a required biome. The search can be aborted with
    // a positive result, as soon as any of those biomes is encountered.
    for (i = 0; i < matchanyLen; i++)
    {
        id = matchany[i];
        if (id < 128)
            bf->biomeToPick |= (1ULL << id);
        else
            bf->biomeToPickM |= (1ULL << (id-128));

        BiomeFilter ibf;
        setupBiomeFilter(&ibf, mc, 0, &id, 1, 0, 0, 0, 0);
        if (i == 0)
        {
            bf->tempsToFind  = ibf.tempsToFind;
            bf->otempToFind  = ibf.otempToFind;
            bf->majorToFind  = ibf.majorToFind;
            bf->edgesToFind  = ibf.edgesToFind;
            bf->raresToFind  = ibf.raresToFind;
            bf->raresToFindM = ibf.raresToFindM;
            bf->shoreToFind  = ibf.shoreToFind;
            bf->shoreToFindM = ibf.shoreToFindM;
            bf->riverToFind  = ibf.riverToFind;
            bf->riverToFindM = ibf.riverToFindM;
            bf->oceanToFind  = ibf.oceanToFind;
        }
        else
        {
            bf->tempsToFind  &= ibf.tempsToFind;
            bf->otempToFind  &= ibf.otempToFind;
            bf->majorToFind  &= ibf.majorToFind;
            bf->edgesToFind  &= ibf.edgesToFind;
            bf->raresToFind  &= ibf.raresToFind;
            bf->raresToFindM &= ibf.raresToFindM;
            bf->shoreToFind  &= ibf.shoreToFind;
            bf->shoreToFindM &= ibf.shoreToFindM;
            bf->riverToFind  &= ibf.riverToFind;
            bf->riverToFindM &= ibf.riverToFindM;
            bf->oceanToFind  &= ibf.oceanToFind;
        }
    }

    // The excluded set is built by checking which of the biomes from each
    // layer have the potential to yield something other than one of the
    // excluded biomes.
    for (i = 0; i < excludedLen; i++)
    {
        id = excluded[i];
        if (id & ~0xbf) // i.e. not in ranges [0,64),[128,192)
        {
            fprintf(stderr, "setupBiomeFilter: biomeID=%d not supported.\n", id);
            exit(-1);
        }
        if (id < 128)
            bf->biomeToExcl |= (1ULL << id);
        else
            bf->biomeToExclM |= (1ULL << (id-128));
    }
    if (excludedLen && mc >= MC_1_7)
    {   // TODO: this does not fully work yet...
        uint64_t b, m;
        int j;
        for (j = Oceanic; j <= Freezing+Special; j++)
        {
            b = m = 0;
            int temp = (j <= Freezing) ? j : ((j - Special) | 0xf00);
            genPotential(&b, &m, L_SPECIAL_1024, mc, flags, temp);
            if ((bf->biomeToExcl & b) || (bf->biomeToExclM & m))
                bf->tempsToExcl |= (1ULL << j);
        }
        for (j = 0; j < 256; j++)
        {
            if (!isOverworld(mc, j))
                continue;
            if (j < 128)
            {
                b = m = 0;
                genPotential(&b, &m, L_BIOME_256, mc, flags, j);
                if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
                    bf->majorToExcl |= (1ULL << j);
            }
            b = m = 0;
            genPotential(&b, &m, L_BIOME_EDGE_64, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->edgesToExcl |= (1ULL << j);
                else // bamboo_jungle are mapped onto & 0x3F
                    bf->edgesToExcl |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_SUNFLOWER_64, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->raresToExcl |= (1ULL << j);
                else
                    bf->raresToExclM |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_SHORE_16, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->shoreToExcl |= (1ULL << j);
                else
                    bf->shoreToExclM |= (1ULL << (j-128));
            }
            b = m = 0;
            genPotential(&b, &m, L_RIVER_MIX_4, mc, flags, j);
            if ((~bf->biomeToExcl & b) || (~bf->biomeToExclM & m))
            {
                if (j < 128)
                    bf->riverToExcl |= (1ULL << j);
                else
                    bf->riverToExclM |= (1ULL << (j-128));
            }
        }
    }

    // The required set is built from the biomes that should be present at each
    // of the layers. The search can be aborted with a negative result as soon
    // as a biome is missing at the corresponding layer.
    for (i = 0; i < requiredLen; i++)
    {
        id = required[i];
        if (id & ~0xbf) // i.e. not in ranges [0,64),[128,192)
        {
            fprintf(stderr, "setupBiomeFilter: biomeID=%d not supported.\n", id);
            exit(-1);
        }

        switch (id)
        {
        case mushroom_fields:
            // mushroom shores can generate with hills and at rivers
            bf->raresToFind |= (1ULL << mushroom_fields);
            // fall through
        case mushroom_field_shore:
            bf->tempsToFind |= (1ULL << Oceanic);
            bf->majorToFind |= (1ULL << mushroom_fields);
            bf->riverToFind |= (1ULL << id);
            break;

        case badlands_plateau:
        case wooded_badlands_plateau:
        case badlands:
        case eroded_badlands:
        case modified_badlands_plateau:
        case modified_wooded_badlands_plateau:
            bf->tempsToFind |= (1ULL << (Warm+Special));
            if (id == badlands_plateau || id == modified_badlands_plateau)
                bf->majorToFind |= (1ULL << badlands_plateau);
            if (id == wooded_badlands_plateau || id == modified_wooded_badlands_plateau)
                bf->majorToFind |= (1ULL << wooded_badlands_plateau);
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case jungle:
        case jungle_edge:
        case jungle_hills:
        case modified_jungle:
        case modified_jungle_edge:
        case bamboo_jungle:
        case bamboo_jungle_hills:
            bf->tempsToFind |= (1ULL << (Lush+Special));
            bf->majorToFind |= (1ULL << jungle);
            if (id == bamboo_jungle || id == bamboo_jungle_hills) {
                // bamboo%64 are End biomes, so we can reuse the edgesToFind
                bf->edgesToFind |= (1ULL << (bamboo_jungle & 0x3f));
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            } else if (id == jungle_edge) {
                // un-modified jungle_edge can be created at shore layer
                bf->riverToFind |= (1ULL << jungle_edge);
            } else {
                if (id == modified_jungle_edge)
                    bf->edgesToFind |= (1ULL << jungle_edge);
                else
                    bf->edgesToFind |= (1ULL << jungle);
                if (id < 128) {
                    bf->raresToFind |= (1ULL << id);
                    bf->riverToFind |= (1ULL << id);
                } else {
                    bf->raresToFindM |= (1ULL << (id-128));
                    bf->riverToFindM |= (1ULL << (id-128));
                }
            }
            break;

        case giant_tree_taiga:
        case giant_tree_taiga_hills:
        case giant_spruce_taiga:
        case giant_spruce_taiga_hills:
            bf->tempsToFind |= (1ULL << (Cold+Special));
            bf->majorToFind |= (1ULL << giant_tree_taiga);
            bf->edgesToFind |= (1ULL << giant_tree_taiga);
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case savanna:
        case savanna_plateau:
        case shattered_savanna:
        case shattered_savanna_plateau:
        case desert_hills:
        case desert_lakes:
            bf->tempsToFind |= (1ULL << Warm);
            if (id == desert_hills || id == desert_lakes) {
                bf->majorToFind |= (1ULL << desert);
                bf->edgesToFind |= (1ULL << desert);
            } else {
                bf->majorToFind |= (1ULL << savanna);
                bf->edgesToFind |= (1ULL << savanna);
            }
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case dark_forest:
        case dark_forest_hills:
        case birch_forest:
        case birch_forest_hills:
        case tall_birch_forest:
        case tall_birch_hills:
        case swamp:
        case swamp_hills:
            bf->tempsToFind |= (1ULL << Lush);
            if (id == dark_forest || id == dark_forest_hills) {
                bf->majorToFind |= (1ULL << dark_forest);
                bf->edgesToFind |= (1ULL << dark_forest);
            }
            else if (id == birch_forest || id == birch_forest_hills ||
                     id == tall_birch_forest || id == tall_birch_hills) {
                bf->majorToFind |= (1ULL << birch_forest);
                bf->edgesToFind |= (1ULL << birch_forest);
            }
            else if (id == swamp || id == swamp_hills) {
                bf->majorToFind |= (1ULL << swamp);
                bf->edgesToFind |= (1ULL << swamp);
            }
            if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case snowy_taiga:
        case snowy_taiga_hills:
        case snowy_taiga_mountains:
        case snowy_tundra:
        case snowy_mountains:
        case ice_spikes:
        case frozen_river:
            bf->tempsToFind |= (1ULL << Freezing);
            if (id == snowy_taiga || id == snowy_taiga_hills ||
                id == snowy_taiga_mountains)
                bf->edgesToFind |= (1ULL << snowy_taiga);
            else
                bf->edgesToFind |= (1ULL << snowy_tundra);
            if (id == frozen_river) {
                bf->raresToFind |= (1ULL << snowy_tundra);
                bf->riverToFind |= (1ULL << id);
            } else if (id < 128) {
                bf->raresToFind |= (1ULL << id);
                bf->riverToFind |= (1ULL << id);
            } else {
                bf->raresToFindM |= (1ULL << (id-128));
                bf->riverToFindM |= (1ULL << (id-128));
            }
            break;

        case sunflower_plains:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case snowy_beach:
            bf->tempsToFind |= (1ULL << Freezing);
            // fall through
        case beach:
        case stone_shore:
            bf->riverToFind |= (1ULL << id);
            break;

        case mountains:
            bf->majorToFind |= (1ULL << mountains);
            // fall through
        case wooded_mountains:
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case gravelly_mountains:
            bf->majorToFind |= (1ULL << mountains);
            // fall through
        case modified_gravelly_mountains:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case taiga:
        case taiga_hills:
            bf->edgesToFind |= (1ULL << taiga);
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case taiga_mountains:
            bf->edgesToFind |= (1ULL << taiga);
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case plains:
        case forest:
        case wooded_hills:
            bf->raresToFind |= (1ULL << id);
            bf->riverToFind |= (1ULL << id);
            break;
        case flower_forest:
            bf->raresToFindM |= (1ULL << (id-128));
            bf->riverToFindM |= (1ULL << (id-128));
            break;

        case desert: // can generate at shore layer
            bf->riverToFind |= (1ULL << id);
            break;

        default:
            if (isOceanic(id)) {
                bf->tempsToFind |= (1ULL << Oceanic);
                bf->oceanToFind |= (1ULL << id);
                if (isShallowOcean(id)) {
                    if (id != lukewarm_ocean && id != cold_ocean)
                        bf->otempToFind |= (1ULL << id);
                } else {
                    if (id == deep_warm_ocean)
                        bf->otempToFind |= (1ULL << warm_ocean);
                    else if (id == deep_ocean)
                        bf->otempToFind |= (1ULL << ocean);
                    else if (id == deep_frozen_ocean)
                        bf->otempToFind |= (1ULL << frozen_ocean);
                    if (!(flags & FORCE_OCEAN_VARIANTS)) {
                        bf->raresToFind |= (1ULL << deep_ocean);
                        bf->riverToFind |= (1ULL << deep_ocean);
                    }
                }
            } else {
                if (id < 64)
                    bf->riverToFind |= (1ULL << id);
                else
                    bf->riverToFindM |= (1ULL << (id-128));
            }
            break;
        }
    }

    bf->biomeToFind = bf->riverToFind;
    bf->biomeToFind &= ~((1ULL << ocean) | (1ULL << deep_ocean));
    bf->biomeToFind |= bf->oceanToFind;
    bf->biomeToFindM = bf->riverToFindM;

    bf->shoreToFind = bf->riverToFind;
    bf->shoreToFind &= ~((1ULL << river) | (1ULL << frozen_river));
    bf->shoreToFindM = bf->riverToFindM;

    bf->specialCnt = 0;
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Warm+Special)));
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Lush+Special)));
    bf->specialCnt += !!(bf->tempsToFind & (1ULL << (Cold+Special)));
}